

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_pointerLikeType_createPointerLikeReinterpretCast
          (sysbvm_context_t *context,sysbvm_tuple_t sourcePointerLikeType_,
          sysbvm_tuple_t targetPointerLikeType_,sysbvm_bitflags_t extraFlags)

{
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *local_40;
  sysbvm_tuple_t local_38;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t *local_28;
  sysbvm_tuple_t sStack_20;
  
  local_40 = &local_38;
  local_28 = (sysbvm_tuple_t *)0x0;
  sStack_20 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 4;
  local_38 = sourcePointerLikeType_;
  local_30 = targetPointerLikeType_;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_28 = (sysbvm_tuple_t *)
             sysbvm_context_shallowCopy(context,(context->roots).pointerLikeReinterpretCast);
  local_28[2] = 0;
  local_28[3] = 0;
  sysbvm_function_addFlags(context,(sysbvm_tuple_t)local_28,0);
  sStack_20 = sysbvm_type_createSimpleFunctionTypeWithArguments1(context,local_38,local_30);
  *local_28 = sStack_20;
  sysbvm_stackFrame_popRecord(&local_58);
  return (sysbvm_tuple_t)local_28;
}

Assistant:

static sysbvm_tuple_t sysbvm_pointerLikeType_createPointerLikeReinterpretCast(sysbvm_context_t *context, sysbvm_tuple_t sourcePointerLikeType_, sysbvm_tuple_t targetPointerLikeType_, sysbvm_bitflags_t extraFlags)
{
    struct {
        sysbvm_tuple_t sourcePointerLikeType;
        sysbvm_tuple_t targetPointerLikeType;
        sysbvm_tuple_t function;
        sysbvm_tuple_t functionType;
    } gcFrame = {
        .sourcePointerLikeType = sourcePointerLikeType_,
        .targetPointerLikeType = targetPointerLikeType_,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.function = sysbvm_function_copy(context, context->roots.pointerLikeReinterpretCast);
    sysbvm_function_addFlags(context, gcFrame.function, extraFlags);

    gcFrame.functionType = sysbvm_type_createSimpleFunctionTypeWithArguments1(context, gcFrame.sourcePointerLikeType, gcFrame.targetPointerLikeType);
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)gcFrame.function, gcFrame.functionType);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.function;
}